

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSqlF(sqlite3 *db,char **pzErrMsg,char *zSql,...)

{
  long lVar1;
  char *pcVar2;
  char **in_RCX;
  sqlite3 *in_R8;
  long in_FS_OFFSET;
  int rc;
  char *z;
  va_list ap;
  void *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  __va_list_tag *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  sqlite3 *in_stack_ffffffffffffff08;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = sqlite3VMPrintf(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8);
  if (pcVar2 == (char *)0x0) {
    local_2c = 7;
  }
  else {
    local_2c = execSql(in_R8,in_RCX,(char *)in_stack_ffffffffffffff08);
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffee8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int execSqlF(sqlite3 *db, char **pzErrMsg, const char *zSql, ...){
  char *z;
  va_list ap;
  int rc;
  va_start(ap, zSql);
  z = sqlite3VMPrintf(db, zSql, ap);
  va_end(ap);
  if( z==0 ) return SQLITE_NOMEM;
  rc = execSql(db, pzErrMsg, z);
  sqlite3DbFree(db, z);
  return rc;
}